

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O0

void __thiscall
Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
setVertexName(Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this,string *newName,int index)

{
  GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pGVar1;
  string local_40;
  int local_1c;
  string *psStack_18;
  int index_local;
  string *newName_local;
  Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  if ((-1 < index) && (index < this->vertexCount)) {
    pGVar1 = this->vertexList;
    local_1c = index;
    psStack_18 = newName;
    newName_local = (string *)this;
    std::__cxx11::string::string((string *)&local_40,(string *)newName);
    GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    setName(pGVar1 + index,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void Graph<T>::setVertexName(std::string newName, int index)
{
  //set the name for the vertex at the passed index if the index is valid
  if(index >= 0 && index < vertexCount)
  {
    vertexList[index].setName(newName);
  }
}